

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

int Saig_ManDemiter(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  int iVar1;
  uint *__ptr;
  void *pvVar2;
  uint *__ptr_00;
  ulong *puVar3;
  uint *__ptr_01;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Aig_Man_t *p_00;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *local_88;
  Aig_Man_t *local_80;
  Aig_Obj_t *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  Aig_Man_t **local_48;
  Aig_Man_t **local_40;
  ulong local_38;
  
  local_48 = ppAig1;
  local_40 = ppAig0;
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x38c,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  Aig_ManSetCioIds(p);
  uVar6 = p->nTruePos;
  local_80 = p;
  __ptr = (uint *)malloc(0x10);
  uVar15 = 8;
  if (6 < uVar6 * 2 - 1) {
    uVar15 = (ulong)(uVar6 * 2);
  }
  __ptr[1] = 0;
  uVar14 = (uint)uVar15;
  *__ptr = uVar14;
  uVar9 = 0;
  if (uVar14 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = malloc((long)(int)uVar14 << 3);
  }
  *(void **)(__ptr + 2) = pvVar2;
  if (0 < (int)uVar6) {
    lVar7 = 0;
    uVar11 = 0;
    lVar12 = 0;
    uVar14 = 1;
    do {
      uVar9 = uVar14;
      if (local_80->vCos->nSize <= lVar12) goto LAB_006631a9;
      iVar1 = Aig_ObjRecognizeExor
                        ((Aig_Obj_t *)
                         (*(ulong *)((long)local_80->vCos->pArray[lVar12] + 8) & 0xfffffffffffffffe)
                         ,&local_78,&local_88);
      pAVar5 = local_78;
      pAVar4 = local_88;
      if (iVar1 == 0) {
        pvVar2 = *(void **)(__ptr + 2);
        iVar1 = 0;
        goto LAB_00663181;
      }
      uVar14 = (uint)uVar15;
      uVar6 = uVar9;
      if (uVar9 - 1 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar2 = malloc(0x80);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar15 = 0x10;
        }
        else {
          uVar15 = (ulong)(uVar14 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar2 = malloc(uVar15 * 8);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr + 2),uVar15 * 8);
          }
        }
        *(void **)(__ptr + 2) = pvVar2;
        *__ptr = (uint)uVar15;
        *(Aig_Obj_t **)((long)pvVar2 + lVar7) = pAVar5;
LAB_00662a76:
        pvVar2 = *(void **)(__ptr + 2);
        pAVar4 = local_88;
      }
      else {
        *(Aig_Obj_t **)(*(long *)(__ptr + 2) + lVar7) = local_78;
        if (uVar9 != uVar14) {
          uVar6 = uVar11 | 1;
          goto LAB_00662a76;
        }
        if (uVar9 - 1 < 0xf) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar2 = malloc(0x80);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar2;
          *__ptr = 0x10;
          uVar15 = 0x10;
        }
        else {
          uVar15 = (ulong)(uVar14 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar2 = malloc(uVar15 * 8);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr + 2),uVar15 * 8);
          }
          *(void **)(__ptr + 2) = pvVar2;
          *__ptr = uVar14 * 2;
        }
      }
      uVar11 = uVar11 + 2;
      __ptr[1] = uVar9 + 1;
      *(Aig_Obj_t **)((long)pvVar2 + (ulong)uVar6 * 8) = pAVar4;
      lVar12 = lVar12 + 1;
      uVar6 = local_80->nTruePos;
      lVar7 = lVar7 + 0x10;
      uVar14 = uVar9 + 2;
    } while (lVar12 < (int)uVar6);
    uVar9 = uVar9 + 1;
  }
  __ptr_00 = (uint *)malloc(0x10);
  uVar15 = 8;
  if (6 < uVar6 - 1) {
    uVar15 = (ulong)uVar6;
  }
  __ptr_00[1] = 0;
  uVar6 = (uint)uVar15;
  *__ptr_00 = uVar6;
  if (uVar6 == 0) {
    puVar3 = (ulong *)0x0;
  }
  else {
    puVar3 = (ulong *)malloc((long)(int)uVar6 * 8);
  }
  *(ulong **)(__ptr_00 + 2) = puVar3;
  __ptr_01 = (uint *)malloc(0x10);
  __ptr_01[1] = 0;
  *__ptr_01 = uVar6;
  if (uVar6 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = malloc((long)(int)uVar6 << 3);
  }
  p_00 = local_80;
  *(void **)(__ptr_01 + 2) = pvVar2;
  if ((int)uVar9 < 1) {
LAB_006631a9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  local_78 = (Aig_Obj_t *)**(ulong **)(__ptr + 2);
  local_88 = (Aig_Obj_t *)(*(ulong **)(__ptr + 2))[1];
  Aig_ManIncrementTravId(local_80);
  Saig_ManDemiterLabel_rec(p_00,(Aig_Obj_t *)((ulong)local_78 & 0xfffffffffffffffe),0);
  pAVar4 = local_78;
  local_70 = uVar15;
  if (uVar6 == 0) {
    if (puVar3 == (ulong *)0x0) {
      puVar3 = (ulong *)malloc(0x80);
    }
    else {
      puVar3 = (ulong *)realloc(puVar3,0x80);
    }
    *(ulong **)(__ptr_00 + 2) = puVar3;
    *__ptr_00 = 0x10;
    local_70 = 0x10;
  }
  *puVar3 = (ulong)pAVar4;
  Aig_ManIncrementTravId(p_00);
  Saig_ManDemiterLabel_rec(p_00,(Aig_Obj_t *)((ulong)local_88 & 0xfffffffffffffffe),1);
  pAVar4 = local_88;
  puVar3 = *(ulong **)(__ptr_01 + 2);
  if (uVar6 == 0) {
    if (puVar3 == (ulong *)0x0) {
      puVar3 = (ulong *)malloc(0x80);
    }
    else {
      puVar3 = (ulong *)realloc(puVar3,0x80);
    }
    *(ulong **)(__ptr_01 + 2) = puVar3;
    *__ptr_01 = 0x10;
    uVar15 = 0x10;
  }
  *puVar3 = (ulong)pAVar4;
  if (2 < uVar9) {
    local_38 = (ulong)uVar9;
    uVar13 = 1;
    local_60 = 1;
    local_58 = local_70;
    local_68 = 1;
    uVar8 = 3;
    local_50 = uVar15;
    do {
      local_78 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + -8 + uVar8 * 8);
      if (local_38 <= uVar8) goto LAB_006631a9;
      local_88 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar8 * 8);
      Aig_ManIncrementTravId(p_00);
      pAVar4 = Saig_ManGetLabeledRegister_rec
                         (p_00,(Aig_Obj_t *)((ulong)local_78 & 0xfffffffffffffffe));
      Aig_ManIncrementTravId(p_00);
      pAVar5 = Saig_ManGetLabeledRegister_rec
                         (p_00,(Aig_Obj_t *)((ulong)local_88 & 0xfffffffffffffffe));
      uVar10 = *(ulong *)&pAVar4->field_0x18;
      uVar6 = (uint)uVar10 & 0x30;
      if (((uVar6 == 0x30) || ((~*(uint *)&pAVar5->field_0x18 & 0x30) == 0)) ||
         ((uVar6 & *(uint *)&pAVar5->field_0x18) != 0)) {
        printf("Ouput pair %4d: Difficult case...\n",uVar13);
        uVar10 = *(ulong *)&pAVar4->field_0x18;
      }
      if ((uVar10 & 0x20) == 0) {
        Saig_ManDemiterLabel_rec(local_80,local_78,0);
        pAVar4 = local_78;
        iVar1 = (int)local_50;
        if ((int)local_60 == iVar1) {
          if (iVar1 < 0x10) {
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar2 = malloc(0x80);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_01 + 2),0x80);
            }
            *(void **)(__ptr_01 + 2) = pvVar2;
            *__ptr_01 = 0x10;
            local_50 = 0x10;
            uVar15 = 0x10;
          }
          else {
            local_50 = (ulong)(uint)(iVar1 * 2);
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar2 = malloc(local_50 * 8);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_01 + 2),local_50 * 8);
            }
            *(void **)(__ptr_01 + 2) = pvVar2;
            *__ptr_01 = (uint)local_50;
            uVar15 = local_50;
          }
        }
        else {
          pvVar2 = *(void **)(__ptr_01 + 2);
        }
        iVar1 = (int)local_60;
        local_60 = (ulong)(iVar1 + 1U);
        __ptr_01[1] = iVar1 + 1U;
      }
      else {
        Saig_ManDemiterLabel_rec(local_80,local_78,1);
        pAVar4 = local_78;
        iVar1 = (int)local_58;
        if ((int)local_68 == iVar1) {
          if (iVar1 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar2 = malloc(0x80);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar2;
            *__ptr_00 = 0x10;
            local_70 = 0x10;
            local_58 = 0x10;
          }
          else {
            local_58 = (ulong)(uint)(iVar1 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar2 = malloc(local_58 * 8);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_00 + 2),local_58 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar2;
            *__ptr_00 = (uint)local_58;
            local_70 = local_58;
          }
        }
        else {
          pvVar2 = *(void **)(__ptr_00 + 2);
        }
        iVar1 = (int)local_68;
        local_68 = (ulong)(iVar1 + 1U);
        __ptr_00[1] = iVar1 + 1U;
      }
      *(Aig_Obj_t **)((long)pvVar2 + (long)iVar1 * 8) = pAVar4;
      if ((pAVar5->field_0x18 & 0x20) == 0) {
        Saig_ManDemiterLabel_rec(local_80,local_88,0);
        pAVar4 = local_88;
        iVar1 = (int)uVar15;
        if ((int)local_60 == iVar1) {
          if (iVar1 < 0x10) {
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar2 = malloc(0x80);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_01 + 2),0x80);
            }
            *(void **)(__ptr_01 + 2) = pvVar2;
            *__ptr_01 = 0x10;
            uVar15 = 0x10;
          }
          else {
            uVar15 = (ulong)(uint)(iVar1 * 2);
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar2 = malloc(uVar15 * 8);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_01 + 2),uVar15 * 8);
            }
            *(void **)(__ptr_01 + 2) = pvVar2;
            *__ptr_01 = iVar1 * 2;
          }
        }
        else {
          pvVar2 = *(void **)(__ptr_01 + 2);
        }
        iVar1 = (int)local_60;
        local_60 = (ulong)(iVar1 + 1U);
        __ptr_01[1] = iVar1 + 1U;
        local_50 = uVar15 & 0xffffffff;
      }
      else {
        Saig_ManDemiterLabel_rec(local_80,local_88,1);
        pAVar4 = local_88;
        iVar1 = (int)local_70;
        if ((int)local_68 == iVar1) {
          if (iVar1 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar2 = malloc(0x80);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar2;
            *__ptr_00 = 0x10;
            uVar10 = 0x10;
          }
          else {
            uVar10 = (ulong)(uint)(iVar1 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar2 = malloc(uVar10 * 8);
            }
            else {
              pvVar2 = realloc(*(void **)(__ptr_00 + 2),uVar10 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar2;
            *__ptr_00 = iVar1 * 2;
          }
        }
        else {
          pvVar2 = *(void **)(__ptr_00 + 2);
          uVar10 = local_70;
        }
        iVar1 = (int)local_68;
        local_68 = (ulong)(iVar1 + 1U);
        __ptr_00[1] = iVar1 + 1U;
        local_70 = uVar10;
        local_58 = uVar10;
      }
      *(Aig_Obj_t **)((long)pvVar2 + (long)iVar1 * 8) = pAVar4;
      uVar13 = (ulong)((int)uVar13 + 1);
      iVar1 = (int)uVar8;
      uVar8 = uVar8 + 2;
      p_00 = local_80;
    } while (iVar1 + 1 < (int)uVar9);
  }
  lVar7 = (long)p_00->nRegs;
  if (0 < lVar7) {
    uVar15 = (ulong)(uint)p_00->nTruePis;
    iVar1 = 0;
    do {
      if ((p_00->nTruePis < 0) || (p_00->vCis->nSize <= (int)uVar15)) goto LAB_006631a9;
      iVar1 = iVar1 + (uint)((~*(uint *)((long)p_00->vCis->pArray[uVar15] + 0x18) & 0x30) == 0);
      uVar15 = uVar15 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    if (iVar1 != 0) {
      printf("The miters contains %d flops reachable from both AIGs.\n");
    }
  }
  if (local_40 != (Aig_Man_t **)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x3d8,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  if (local_48 != (Aig_Man_t **)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x3df,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  if (*(void **)(__ptr_01 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_01 + 2));
  }
  free(__ptr_01);
  pvVar2 = *(void **)(__ptr + 2);
  iVar1 = 1;
LAB_00663181:
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
  }
  free(__ptr);
  return iVar1;
}

Assistant:

int Saig_ManDemiter( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vPairs, * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1, * pFlop0, * pFlop1;
    int i, Counter;
    assert( Saig_ManRegNum(p) > 0 );
    Aig_ManSetCioIds( p );
    // check if demitering is possible
    vPairs = Vec_PtrAlloc( 2 * Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Aig_ObjRecognizeExor( Aig_ObjFanin0(pObj), &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vPairs );
            return 0;
        }
        Vec_PtrPush( vPairs, pObj0 );
        Vec_PtrPush( vPairs, pObj1 );
    }
    // start array of outputs
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    // get the first pair of outputs
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 0 );
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 1 );
    // label registers reachable from the outputs
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj0), 0 );
    Vec_PtrPush( vSet0, pObj0 );
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj1), 1 );
    Vec_PtrPush( vSet1, pObj1 );
    // find where each output belongs
    for ( i = 2; i < Vec_PtrSize(vPairs); i += 2 )
    {
        pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i   );
        pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i+1 );

        Aig_ManIncrementTravId( p );
        pFlop0 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj0) );

        Aig_ManIncrementTravId( p );
        pFlop1 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj1) );

        if ( (pFlop0->fMarkA && pFlop0->fMarkB) || (pFlop1->fMarkA && pFlop1->fMarkB) || 
             (pFlop0->fMarkA && pFlop1->fMarkA) || (pFlop0->fMarkB && pFlop1->fMarkB)  )
            printf( "Ouput pair %4d: Difficult case...\n", i/2 );

        if ( pFlop0->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 1 );
            Vec_PtrPush( vSet0, pObj0 );
        }
        else // if ( pFlop0->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 0 );
            Vec_PtrPush( vSet1, pObj0 );
        }

        if ( pFlop1->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 1 );
            Vec_PtrPush( vSet0, pObj1 );
        }
        else // if ( pFlop1->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
    }
    // check if there are any flops in common
    Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( pObj->fMarkA && pObj->fMarkB )
            Counter++;
    if ( Counter > 0 )
        printf( "The miters contains %d flops reachable from both AIGs.\n", Counter );

    // produce two miters
    if ( ppAig0 )
    {
        assert( 0 );
        *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 ); // not ready
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        assert( 0 );
        *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 ); // not ready
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Vec_PtrFree( vPairs );
    return 1;
}